

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# create_response.h
# Opt level: O1

string __thiscall CreateResponse::ToString(CreateResponse *this)

{
  unsigned_long_long *puVar1;
  long *plVar2;
  undefined8 *puVar3;
  undefined1 local_68 [16];
  undefined1 local_58 [24];
  string local_40;
  _func_int **local_38;
  unsigned_long_long local_30;
  unsigned_long_long local_28;
  long local_20;
  
  FileInfo::ToString((FileInfo *)&local_38);
  puVar1 = (unsigned_long_long *)std::string::insert((ulong)&local_38,(char *)0x0,0x127503);
  local_30 = *puVar1;
  *puVar1 = (unsigned_long_long)std::string::insert;
  puVar1 = (unsigned_long_long *)std::string::append((char *)&local_30,0x12802c);
  local_58._8_8_ = *puVar1;
  *puVar1 = (unsigned_long_long)std::string::insert;
  FileInfo::ToString((FileInfo *)local_58);
  if ((*(_func_int **)(local_58._8_8_ - 0x10) <
       *(_func_int **)(local_58._0_8_ + -0x18) + *(long *)(local_58._8_8_ - 0x18)) &&
     (*(_func_int **)(local_58._0_8_ + -0x18) + *(long *)(local_58._8_8_ - 0x18) <=
      *(_func_int **)(local_58._0_8_ + -0x10))) {
    puVar1 = (unsigned_long_long *)
             std::string::insert((ulong)local_58,(string *)0x0,(ulong)(local_58 + 8),0);
  }
  else {
    puVar1 = (unsigned_long_long *)std::string::append((string *)(local_58 + 8));
  }
  local_28 = *puVar1;
  *puVar1 = (unsigned_long_long)std::string::insert;
  puVar1 = (unsigned_long_long *)std::string::append((char *)&local_28,0x12802c);
  local_58._16_8_ = *puVar1;
  *puVar1 = (unsigned_long_long)std::string::insert;
  BlockInfo::ToString((BlockInfo *)(local_68 + 8));
  if ((*(_func_int **)(local_58._16_8_ - 0x10) <
       *(_func_int **)(local_68._8_8_ + -0x18) + *(long *)(local_58._16_8_ - 0x18)) &&
     (*(_func_int **)(local_68._8_8_ + -0x18) + *(long *)(local_58._16_8_ - 0x18) <=
      *(_func_int **)(local_68._8_8_ + -0x10))) {
    plVar2 = (long *)std::string::insert((ulong)(local_68 + 8),(string *)0x0,
                                         (ulong)(local_58 + 0x10),0);
  }
  else {
    plVar2 = (long *)std::string::append((string *)(local_58 + 0x10));
  }
  local_20 = *plVar2;
  *plVar2 = (long)std::string::insert;
  puVar1 = (unsigned_long_long *)std::string::append((char *)&local_20,0x12802c);
  local_40._M_dataplus._M_p = (_Alloc_hider)*puVar1;
  *puVar1 = (unsigned_long_long)std::string::insert;
  BlockInfo::ToString((BlockInfo *)local_68);
  if ((*(_func_int **)((long)local_40._M_dataplus._M_p - 0x10) <
       *(_func_int **)(local_68._0_8_ + -0x18) + *(long *)((long)local_40._M_dataplus._M_p - 0x18))
     && (*(_func_int **)(local_68._0_8_ + -0x18) + *(long *)((long)local_40._M_dataplus._M_p - 0x18)
         <= *(_func_int **)(local_68._0_8_ + -0x10))) {
    puVar3 = (undefined8 *)std::string::insert((ulong)local_68,(string *)0x0,(ulong)&local_40,0);
  }
  else {
    puVar3 = (undefined8 *)std::string::append(&local_40);
  }
  (this->super_NamenodeResponse).super_RpcMessage._vptr_RpcMessage = (_func_int **)*puVar3;
  *puVar3 = std::string::insert;
  std::string::_Rep::_M_dispose((allocator *)(local_68._0_8_ + -0x18));
  std::string::_Rep::_M_dispose((allocator *)((long)local_40._M_dataplus._M_p - 0x18));
  std::string::_Rep::_M_dispose((allocator *)(local_20 + -0x18));
  std::string::_Rep::_M_dispose((allocator *)(local_68._8_8_ + -0x18));
  std::string::_Rep::_M_dispose((allocator *)(local_58._16_8_ - 0x18));
  std::string::_Rep::_M_dispose((allocator *)(local_28 - 0x18));
  std::string::_Rep::_M_dispose((allocator *)(local_58._0_8_ + -0x18));
  std::string::_Rep::_M_dispose((allocator *)(local_58._8_8_ - 0x18));
  std::string::_Rep::_M_dispose((allocator *)(local_30 - 0x18));
  std::string::_Rep::_M_dispose((allocator *)(local_38 + -3));
  return (string)(_Alloc_hider)this;
}

Assistant:

virtual string ToString() const {
    return "CreateResponse:: " + file_info_.ToString() + ", " +
           parent_info_.ToString() + ", " + file_block_->ToString() + ", " +
           parent_block_->ToString();
  }